

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O3

int av1_get_force_skip_low_temp_var(uint8_t *variance_low,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = (int)CONCAT71(in_register_00000009,bsize);
  if (iVar2 - 6U < 10) {
    uVar3 = mi_col & 0x1f;
    uVar1 = (uint)mi_row >> 3 & 2 | uVar3 >> 4;
    uVar4 = (uint)mi_row >> 2;
    uVar5 = uVar4 & 2 | (uint)mi_col >> 3 & 1;
    switch(iVar2) {
    default:
      variance_low = variance_low +
                     (ulong)((uVar1 << 4 | (uint)mi_col >> 2 & 1 | (uint)mi_row >> 1 & 2) +
                            uVar5 * 4) + 0x29;
      break;
    case 9:
      variance_low = variance_low + (ulong)(uVar5 + uVar1 * 4) + 0x19;
      break;
    case 10:
      variance_low = variance_low + (ulong)(uVar4 & 4 | uVar3 >> 3) + 0x11;
      break;
    case 0xb:
      variance_low = variance_low +
                     (ulong)(uVar4 & 4 | ((uint)mi_row >> 3 & 1) + (uVar3 >> 4) * 2) + 9;
      break;
    case 0xc:
      variance_low = variance_low + (ulong)uVar1 + 5;
      break;
    case 0xd:
      variance_low = variance_low + (4 - (ulong)(uVar3 == 0));
      break;
    case 0xe:
      variance_low = variance_low + (2 - (ulong)((mi_row & 0x1fU) == 0));
      break;
    case 0xf:
      break;
    }
    return (int)*variance_low;
  }
  return 0;
}

Assistant:

int av1_get_force_skip_low_temp_var(const uint8_t *variance_low, int mi_row,
                                    int mi_col, BLOCK_SIZE bsize) {
  int force_skip_low_temp_var = 0;
  int x, y;
  x = (mi_col & 0x1F) >> 4;
  // y = (mi_row & 0x1F) >> 4;
  // const int idx64 = (y << 1) + x;
  y = (mi_row & 0x17) >> 3;
  const int idx64 = y + x;

  x = (mi_col & 0xF) >> 3;
  // y = (mi_row & 0xF) >> 3;
  // const int idx32 = (y << 1) + x;
  y = (mi_row & 0xB) >> 2;
  const int idx32 = y + x;

  x = (mi_col & 0x7) >> 2;
  // y = (mi_row & 0x7) >> 2;
  // const int idx16 = (y << 1) + x;
  y = (mi_row & 0x5) >> 1;
  const int idx16 = y + x;
  // Set force_skip_low_temp_var based on the block size and block offset.
  switch (bsize) {
    case BLOCK_128X128: force_skip_low_temp_var = variance_low[0]; break;
    case BLOCK_128X64:
      assert((mi_col & 0x1F) == 0);
      force_skip_low_temp_var = variance_low[1 + ((mi_row & 0x1F) != 0)];
      break;
    case BLOCK_64X128:
      assert((mi_row & 0x1F) == 0);
      force_skip_low_temp_var = variance_low[3 + ((mi_col & 0x1F) != 0)];
      break;
    case BLOCK_64X64:
      // Location of this 64x64 block inside the 128x128 superblock
      force_skip_low_temp_var = variance_low[5 + idx64];
      break;
    case BLOCK_64X32:
      x = (mi_col & 0x1F) >> 4;
      y = (mi_row & 0x1F) >> 3;
      /*
      .---------------.---------------.
      | x=0,y=0,idx=0 | x=0,y=0,idx=2 |
      :---------------+---------------:
      | x=0,y=1,idx=1 | x=1,y=1,idx=3 |
      :---------------+---------------:
      | x=0,y=2,idx=4 | x=1,y=2,idx=6 |
      :---------------+---------------:
      | x=0,y=3,idx=5 | x=1,y=3,idx=7 |
      '---------------'---------------'
      */
      const int idx64x32 = (x << 1) + (y % 2) + ((y >> 1) << 2);
      force_skip_low_temp_var = variance_low[9 + idx64x32];
      break;
    case BLOCK_32X64:
      x = (mi_col & 0x1F) >> 3;
      y = (mi_row & 0x1F) >> 4;
      const int idx32x64 = (y << 2) + x;
      force_skip_low_temp_var = variance_low[17 + idx32x64];
      break;
    case BLOCK_32X32:
      force_skip_low_temp_var = variance_low[25 + (idx64 << 2) + idx32];
      break;
    case BLOCK_32X16:
    case BLOCK_16X32:
    case BLOCK_16X16:
      force_skip_low_temp_var =
          variance_low[41 + (idx64 << 4) + (idx32 << 2) + idx16];
      break;
    default: break;
  }
  return force_skip_low_temp_var;
}